

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O2

uint __thiscall test_app::cache_size(test_app *this)

{
  char cVar1;
  uint *puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  uint keys;
  uint triggers;
  string local_1b0 [32];
  ostringstream oss;
  
  puVar2 = (uint *)cppcms::application::cache();
  cVar1 = cppcms::cache_interface::stats(puVar2,&keys);
  if (cVar1 != '\0') {
    return keys;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x144);
  std::operator<<(poVar3," cache().stats(keys,triggers)");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned cache_size()
	{
		unsigned keys,triggers;
		TEST(cache().stats(keys,triggers));
		return keys;
	}